

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codadump.c
# Opt level: O1

void main_cold_12(void)

{
  FILE *__stream;
  undefined4 *puVar1;
  undefined8 uVar2;
  
  __stream = _stderr;
  puVar1 = (undefined4 *)coda_get_errno();
  uVar2 = coda_errno_to_string(*puVar1);
  fprintf(__stream,"ERROR: %s\n",uVar2);
  exit(1);
}

Assistant:

static void handle_json_run_mode(int argc, char *argv[])
{
    int use_special_types;
    int perform_conversions;
    int include_attributes;
    int i;

    traverse_info.file_name = NULL;
    output_file_name = NULL;
    starting_path = NULL;
    ascii_output = stdout;
    use_special_types = 1;
    perform_conversions = 1;
    include_attributes = 0;

    for (i = 0; i < argc; i++)
    {
        if (strcmp(argv[i], "-a") == 0 || strcmp(argv[i], "--attributes") == 0)
        {
            include_attributes = 1;
        }
        else if (strcmp(argv[i], "-d") == 0 || strcmp(argv[i], "--disable_conversions") == 0)
        {
            perform_conversions = 0;
        }
        else if ((strcmp(argv[i], "-o") == 0 || strcmp(argv[i], "--output") == 0) && i + 1 < argc &&
                 argv[i + 1][0] != '-')
        {
            output_file_name = argv[i + 1];
            i++;
        }
        else if ((strcmp(argv[i], "-p") == 0 || strcmp(argv[i], "--path") == 0) && i + 1 < argc &&
                 argv[i + 1][0] != '-')
        {
            starting_path = argv[i + 1];
            i++;
        }
        else if (strcmp(argv[i], "--no_special_types") == 0)
        {
            use_special_types = 0;
        }
        else if (i == argc - 1 && argv[i][0] != '-')
        {
            traverse_info.file_name = argv[i];
        }
        else
        {
            fprintf(stderr, "ERROR: invalid arguments\n");
            print_help();
            exit(1);
        }
    }

    if (traverse_info.file_name == NULL || traverse_info.file_name[0] == '\0')
    {
        fprintf(stderr, "ERROR: invalid arguments\n");
        print_help();
        exit(1);
    }

    if (coda_init() != 0)
    {
        fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
        exit(1);
    }
    coda_set_option_bypass_special_types(!use_special_types);
    coda_set_option_perform_conversions(perform_conversions);
    if (output_file_name != NULL)
    {
        ascii_output = fopen(output_file_name, "w");
        if (ascii_output == NULL)
        {
            fprintf(stderr, "ERROR: could not create output file \"%s\"\n", output_file_name);
            exit(1);
        }
    }

    print_json_data(include_attributes);

    if (output_file_name != NULL)
    {
        fclose(ascii_output);
    }
    coda_done();
}